

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmAffinity.cxx
# Opt level: O0

set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *
cmAffinity::GetProcessorsAvailable(void)

{
  int iVar1;
  int iVar2;
  pthread_t __th;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *in_RDI;
  uint local_f4;
  value_type_conflict local_c8;
  uint local_bc;
  ulong local_b8;
  size_t __cpu;
  undefined1 local_a8 [4];
  int i;
  cm_cpuset_t cpuset;
  int cpumask_size;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *processorsAvailable;
  
  std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::set(in_RDI);
  iVar1 = uv_cpumask_size();
  if (0 < iVar1) {
    memset(local_a8,0,0x80);
    __th = pthread_self();
    iVar2 = pthread_getaffinity_np(__th,0x80,(cpu_set_t *)local_a8);
    if (iVar2 == 0) {
      for (__cpu._4_4_ = 0; __cpu._4_4_ < iVar1; __cpu._4_4_ = __cpu._4_4_ + 1) {
        local_b8 = (ulong)__cpu._4_4_;
        if (local_b8 >> 3 < 0x80) {
          local_f4 = (uint)((cpuset.__bits[(local_b8 >> 6) - 1] & 1L << ((byte)__cpu._4_4_ & 0x3f))
                           != 0);
        }
        else {
          local_f4 = 0;
        }
        local_bc = local_f4;
        if (local_f4 != 0) {
          local_c8 = (value_type_conflict)__cpu._4_4_;
          std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::insert
                    (in_RDI,&local_c8);
        }
      }
    }
  }
  return in_RDI;
}

Assistant:

std::set<size_t> GetProcessorsAvailable()
{
  std::set<size_t> processorsAvailable;
#ifdef CM_HAVE_CPU_AFFINITY
  int cpumask_size = uv_cpumask_size();
  if (cpumask_size > 0) {
#  ifdef _WIN32
    DWORD_PTR procmask;
    DWORD_PTR sysmask;
    if (GetProcessAffinityMask(GetCurrentProcess(), &procmask, &sysmask) !=
        0) {
      for (int i = 0; i < cpumask_size; ++i) {
        if (procmask & (((DWORD_PTR)1) << i)) {
          processorsAvailable.insert(i);
        }
      }
    }
#  else
    cm_cpuset_t cpuset;
    CPU_ZERO(&cpuset); // NOLINT(clang-tidy)
    if (pthread_getaffinity_np(pthread_self(), sizeof(cpuset), &cpuset) == 0) {
      for (int i = 0; i < cpumask_size; ++i) {
        if (CPU_ISSET(i, &cpuset)) {
          processorsAvailable.insert(i);
        }
      }
    }
#  endif
  }
#endif
  return processorsAvailable;
}